

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library_open.c
# Opt level: O0

mpt_libhandle * mpt_library_attach(mpt_libhandle *lh)

{
  int *piVar1;
  uintptr_t uVar2;
  mpt_libhandle *lh_local;
  
  if (lh == (mpt_libhandle *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    lh_local = (mpt_libhandle *)0x0;
  }
  else {
    uVar2 = __mpt_library_proxy_addref(&lh->_ref);
    lh_local = lh;
    if (uVar2 == 0) {
      piVar1 = __errno_location();
      *piVar1 = 0xb;
      lh_local = (mpt_libhandle *)0x0;
    }
  }
  return lh_local;
}

Assistant:

extern MPT_STRUCT(libhandle) *mpt_library_attach(MPT_STRUCT(libhandle) *lh)
{
	if (!lh) {
		errno = EINVAL;
		return 0;
	}
	if (!__mpt_library_proxy_addref(&lh->_ref)) {
		errno = EAGAIN;
		return 0;
	}
	return lh;
}